

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Int128 Omega_h::int128_sum(Reals *a,double unit)

{
  Int128 IVar1;
  undefined1 local_110 [8];
  type transform;
  Int128Plus op;
  Int128 init;
  IntIterator last;
  IntIterator first;
  double unit_local;
  Reals *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 3) == 0) {
    IVar1 = (Int128)ZEXT816(0);
  }
  else {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    transform.unit._7_1_ = 0;
    Read<double>::Read((Read<double> *)local_110,a);
    transform.a.write_.shared_alloc_.direct_ptr = (void *)unit;
    IVar1 = transform_reduce<Omega_h::IntIterator,Omega_h::int128_sum(Omega_h::Read<double>,double)::__0,Omega_h::Int128,Omega_h::Int128Plus>
                      (0,(int)(local_20 >> 3),0,0,(Read<double> *)local_110);
    int128_sum(Omega_h::Read<double>,double)::$_0::~__0((__0 *)local_110);
  }
  return IVar1;
}

Assistant:

Int128 int128_sum(Reals const a, double const unit) {
  if (a.size() == 0) {
    return Int128(0);
  }
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = Int128(0);
  auto const op = Int128Plus();
  auto transform = OMEGA_H_LAMBDA(LO i)->Int128 {
    return Int128::from_double(a[i], unit);
  };
  return transform_reduce(first, last, init, op, std::move(transform));
}